

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<2,_2,_9,_2,_3>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int in_ECX;
  VecAccess<float,_4,_3> local_80;
  undefined1 local_58 [48];
  Vec3 local_28;
  Vector<float,_3> local_1c;
  ShaderEvalContext *local_10;
  ShaderEvalContext *evalCtx_local;
  
  local_10 = evalCtx;
  getInputValue<2,9>((Mat3 *)(local_58 + 0xc),(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,
                     in_ECX);
  getInputValue<2,3>((ShaderEvalContext *)local_58,(int)local_10);
  tcu::operator*((tcu *)&local_28,(Matrix<float,_3,_3> *)(local_58 + 0xc),
                 (Vector<float,_3> *)local_58);
  reduceToVec3((MatrixCaseUtils *)&local_1c,&local_28);
  tcu::Vector<float,_4>::xyz(&local_80,&local_10->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_80,&local_1c);
  tcu::Matrix<float,_3,_3>::~Matrix((Matrix<float,_3,_3> *)(local_58 + 0xc));
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) * getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}